

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::executeParse(File *this)

{
  TSParser *self;
  TSInput input;
  Snapshot *this_00;
  TSTree *pTVar1;
  TSInput local_70;
  undefined1 local_48 [8];
  TextBufferInput textBufferInput;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  chunks;
  Snapshot *snapshot;
  File *this_local;
  
  this_00 = TextBuffer::create_snapshot(&this->buffer);
  TextBuffer::Snapshot::primitive_chunks
            ((vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
              *)&textBufferInput.slice_offset_,this_00);
  TextBufferInput::TextBufferInput
            ((TextBufferInput *)local_48,
             (vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
              *)&textBufferInput.slice_offset_);
  self = this->parser;
  pTVar1 = this->tree;
  TextBufferInput::input(&local_70,(TextBufferInput *)local_48);
  input.read = local_70.read;
  input.payload = local_70.payload;
  input.encoding = local_70.encoding;
  input._20_4_ = local_70._20_4_;
  pTVar1 = ts_parser_parse(self,pTVar1,input);
  this->tree = pTVar1;
  if (this_00 != (Snapshot *)0x0) {
    TextBuffer::Snapshot::~Snapshot(this_00);
    operator_delete(this_00,0x18);
  }
  std::
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  ::~vector((vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
             *)&textBufferInput.slice_offset_);
  return;
}

Assistant:

void File::executeParse () {
    auto snapshot = buffer.create_snapshot(); // NOTE: Looks like this can be done without creating a snapshot

    auto chunks = snapshot->primitive_chunks();

    TextBufferInput textBufferInput { &chunks };

    tree = ts_parser_parse(parser, tree, textBufferInput.input());

//    std::cerr << "tree:\n";
//    std::cerr << ts_node_string(ts_tree_root_node(tree)) << "\n";

    delete snapshot;
}